

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int spiRead(uint handle,char *buf,uint count)

{
  FILE *pFVar1;
  int iVar2;
  char *__format;
  ulong uVar3;
  
  pFVar1 = _stderr;
  uVar3 = (ulong)handle;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(count,buf);
    fprintf(pFVar1,"%s %s: handle=%d count=%d [%s]\n",myTimeStamp::buf,"spiRead",uVar3,(ulong)count,
            myBuf2Str::str);
  }
  pFVar1 = _stderr;
  if (libInitialised == '\0') {
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    fprintf(pFVar1,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,"spiRead"
           );
    return -0x1f;
  }
  if ((handle < 0x20) && (spiInfo[uVar3].state == 2)) {
    if (count < 0x10001) {
      spiGo(spiInfo[uVar3].speed,spiInfo[uVar3].flags,(char *)0x0,buf,count);
      return count;
    }
    iVar2 = -0x54;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x54;
    }
    myTimeStamp();
    __format = "%s %s: bad count (%d)\n";
    uVar3 = (ulong)count;
  }
  else {
    iVar2 = -0x19;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x19;
    }
    myTimeStamp();
    __format = "%s %s: bad handle (%d)\n";
  }
  fprintf(pFVar1,__format,myTimeStamp::buf,"spiRead",uVar3);
  return iVar2;
}

Assistant:

int spiRead(unsigned handle, char *buf, unsigned count)
{
   DBG(DBG_USER, "handle=%d count=%d [%s]",
      handle, count, myBuf2Str(count, buf));

   CHECK_INITED;

   if (handle >= PI_SPI_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (spiInfo[handle].state != PI_SPI_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (count > PI_MAX_SPI_DEVICE_COUNT)
      SOFT_ERROR(PI_BAD_SPI_COUNT, "bad count (%d)", count);

   spiGo(spiInfo[handle].speed, spiInfo[handle].flags, NULL, buf, count);

   return count;
}